

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_main_loop__alsa(ma_device *pDevice)

{
  ma_uint32 mVar1;
  ulong uVar2;
  ma_data_converter *pConverter;
  ma_result mVar3;
  int iVar4;
  uint uVar5;
  ma_result mVar6;
  ma_device_type mVar7;
  ma_result in_ECX;
  uint uVar8;
  uint uVar9;
  ma_uint32 framesToWriteThisIteration;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  bool bVar13;
  ma_uint64 capturedClientFramesToProcessThisIteration;
  uint local_4070;
  ma_uint32 capturedDeviceFramesToProcess;
  undefined8 local_4068;
  ma_uint64 convertedDeviceFrameCount;
  ma_uint64 convertedClientFrameCount;
  ma_uint64 capturedDeviceFramesToProcessThisIteration;
  ma_data_converter *local_4048;
  ma_data_converter *local_4040;
  ma_uint8 playbackDeviceData [4096];
  ma_uint8 capturedDeviceData [4096];
  ma_uint8 playbackClientData [4096];
  ma_uint8 capturedClientData [4096];
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x45ab,"ma_result ma_device_main_loop__alsa(ma_device *)");
  }
  if (((pDevice->type & ~ma_device_type_playback) == ma_device_type_capture) &&
     (iVar4 = (*(pDevice->pContext->field_21).alsa.snd_pcm_start)
                        ((pDevice->field_23).alsa.pPCMCapture), iVar4 < 0)) {
    mVar6 = ma_result_from_errno(-iVar4);
    ma_post_error(pDevice,1,"[ALSA] Failed to start device in preparation for reading.",in_ECX);
    return mVar6;
  }
  local_4040 = &(pDevice->capture).converter;
  local_4048 = &(pDevice->playback).converter;
  uVar12 = 0;
  mVar6 = 0;
LAB_001064f5:
  do {
    bVar13 = (int)uVar12 == 0;
    mVar7 = pDevice->type;
    do {
      if ((pDevice->state != 2) || (!bVar13)) {
        if ((mVar7 & ~ma_device_type_playback) == ma_device_type_capture) {
          (*(pDevice->pContext->field_21).alsa.snd_pcm_drain)((pDevice->field_23).alsa.pPCMCapture);
          (*(pDevice->pContext->field_21).alsa.snd_pcm_prepare)
                    ((pDevice->field_23).alsa.pPCMCapture);
          mVar7 = pDevice->type;
        }
        if ((mVar7 | ma_device_type_capture) == ma_device_type_duplex) {
          (*(pDevice->pContext->field_21).alsa.snd_pcm_drain)((pDevice->field_23).alsa.pPCMPlayback)
          ;
          (*(pDevice->pContext->field_21).alsa.snd_pcm_prepare)
                    ((pDevice->field_23).alsa.pPCMPlayback);
          return mVar6;
        }
        return mVar6;
      }
      if (mVar7 == ma_device_type_playback) {
        if ((undefined1  [608])((undefined1  [608])pDevice->field_23 & (undefined1  [608])0x1) !=
            (undefined1  [608])0x0) {
          return -3;
        }
        uVar5 = (pDevice->playback).internalPeriodSizeInFrames;
        uVar8 = (uint)(0x1000 / (ulong)(*(int *)(&DAT_001127b0 +
                                                (ulong)(pDevice->playback).internalFormat * 4) *
                                       (pDevice->playback).internalChannels));
        uVar9 = 0;
        mVar3 = mVar6;
        goto LAB_00106777;
      }
      if (mVar7 == ma_device_type_capture) {
        if ((undefined1  [608])((undefined1  [608])pDevice->field_23 & (undefined1  [608])0x2) !=
            (undefined1  [608])0x0) {
          return -3;
        }
        uVar5 = (pDevice->capture).internalPeriodSizeInFrames;
        iVar4 = *(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).internalFormat * 4);
        mVar1 = (pDevice->capture).internalChannels;
        uVar8 = 0;
        goto LAB_00106806;
      }
      bVar13 = true;
    } while (mVar7 != ma_device_type_duplex);
    if ((undefined1  [608])((undefined1  [608])pDevice->field_23 & (undefined1  [608])0x3) !=
        (undefined1  [608])0x0) {
      return -3;
    }
    uVar5 = (pDevice->capture).internalPeriodSizeInFrames;
    local_4070 = (pDevice->playback).internalPeriodSizeInFrames;
    if (uVar5 < local_4070) {
      local_4070 = uVar5;
    }
    uVar5 = 0;
    uVar12 = 0;
    while( true ) {
      uVar8 = local_4070 - uVar5;
      if (local_4070 < uVar5 || uVar8 == 0) break;
      mVar1 = (pDevice->playback).internalChannels;
      iVar4 = *(int *)(&DAT_001127b0 + (ulong)(pDevice->playback).internalFormat * 4);
      uVar9 = (uint)(0x1000 / (ulong)(*(int *)(&DAT_001127b0 +
                                              (ulong)(pDevice->capture).internalFormat * 4) *
                                     (pDevice->capture).internalChannels));
      if (uVar9 <= uVar8) {
        uVar8 = uVar9;
      }
      mVar6 = ma_device_read__alsa(pDevice,capturedDeviceData,uVar8,&capturedDeviceFramesToProcess);
      pConverter = local_4048;
      if (mVar6 != 0) {
        uVar12 = 1;
        break;
      }
      iVar10 = 0;
      uVar8 = capturedDeviceFramesToProcess;
      local_4068 = uVar12;
      while( true ) {
        uVar2 = 0x1000 / (ulong)(*(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).format * 4) *
                                (pDevice->capture).channels);
        capturedClientFramesToProcessThisIteration =
             0x1000 / (ulong)(*(int *)(&DAT_001127b0 + (ulong)(pDevice->playback).format * 4) *
                             (pDevice->playback).channels);
        if ((uint)uVar2 < (uint)capturedClientFramesToProcessThisIteration) {
          capturedClientFramesToProcessThisIteration = uVar2;
        }
        capturedDeviceFramesToProcessThisIteration = (ma_uint64)uVar8;
        mVar6 = ma_data_converter_process_pcm_frames
                          (local_4040,
                           capturedDeviceData +
                           (pDevice->capture).internalChannels * iVar10 *
                           *(int *)(&DAT_001127b0 + (ulong)(pDevice->capture).internalFormat * 4),
                           &capturedDeviceFramesToProcessThisIteration,capturedClientData,
                           &capturedClientFramesToProcessThisIteration);
        uVar12 = local_4068;
        if (mVar6 != 0) goto LAB_00106713;
        if (capturedClientFramesToProcessThisIteration == 0) break;
        ma_device__on_data(pDevice,playbackClientData,capturedClientData,
                           (ma_uint32)capturedClientFramesToProcessThisIteration);
        iVar10 = iVar10 + (int)capturedDeviceFramesToProcessThisIteration;
        uVar8 = uVar8 - (int)capturedDeviceFramesToProcessThisIteration;
        do {
          convertedDeviceFrameCount = 0x1000 / (ulong)(iVar4 * mVar1);
          convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
          mVar6 = ma_data_converter_process_pcm_frames
                            (pConverter,playbackClientData,&convertedClientFrameCount,
                             playbackDeviceData,&convertedDeviceFrameCount);
          if (mVar6 != 0) {
LAB_00106702:
            uVar12 = 1;
            goto LAB_00106713;
          }
          mVar6 = ma_device_write__alsa
                            (pDevice,playbackDeviceData,(ma_uint32)convertedDeviceFrameCount,
                             (ma_uint32 *)0x0);
          if (mVar6 != 0) goto LAB_00106702;
          capturedClientFramesToProcessThisIteration =
               capturedClientFramesToProcessThisIteration - (convertedClientFrameCount & 0xffffffff)
          ;
        } while (capturedClientFramesToProcessThisIteration != 0);
      }
      mVar6 = 0;
LAB_00106713:
      uVar5 = uVar5 + iVar10;
    }
  } while( true );
  while( true ) {
    if (uVar8 <= uVar11) {
      uVar11 = uVar8;
    }
    ma_device__read_frames_from_client(pDevice,uVar11,capturedDeviceData);
    mVar6 = ma_device_write__alsa(pDevice,capturedDeviceData,uVar11,(ma_uint32 *)playbackDeviceData)
    ;
    uVar9 = uVar9 + playbackDeviceData._0_4_;
    mVar3 = 0;
    if (mVar6 != 0) break;
LAB_00106777:
    mVar6 = mVar3;
    uVar11 = uVar5 - uVar9;
    if (uVar5 < uVar9 || uVar11 == 0) {
      uVar12 = 0;
      goto LAB_001064f5;
    }
  }
  uVar12 = 1;
  goto LAB_001064f5;
LAB_00106806:
  uVar9 = uVar5 - uVar8;
  if (uVar5 < uVar8 || uVar9 == 0) goto LAB_00106844;
  uVar11 = (uint)(0x1000 / (ulong)(iVar4 * mVar1));
  if (uVar11 <= uVar9) {
    uVar9 = uVar11;
  }
  mVar6 = ma_device_read__alsa(pDevice,capturedDeviceData,uVar9,(ma_uint32 *)playbackDeviceData);
  if (mVar6 != 0) {
    uVar12 = 1;
    goto LAB_001064f5;
  }
  ma_device__send_frames_to_client(pDevice,playbackDeviceData._0_4_,capturedDeviceData);
  uVar8 = uVar8 + playbackDeviceData._0_4_;
  mVar6 = 0;
  goto LAB_00106806;
LAB_00106844:
  uVar12 = 0;
  goto LAB_001064f5;
}

Assistant:

static ma_result ma_device_main_loop__alsa(ma_device* pDevice)
{
    ma_result result = MA_SUCCESS;
    int resultALSA;
    ma_bool32 exitLoop = MA_FALSE;

    MA_ASSERT(pDevice != NULL);

    /* Capture devices need to be started immediately. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        resultALSA = ((ma_snd_pcm_start_proc)pDevice->pContext->alsa.snd_pcm_start)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);
        if (resultALSA < 0) {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to start device in preparation for reading.", ma_result_from_errno(-resultALSA));
        }
    }

    while (ma_device__get_state(pDevice) == MA_STATE_STARTED && !exitLoop) {
        switch (pDevice->type)
        {
            case ma_device_type_duplex:
            {
                if (pDevice->alsa.isUsingMMapCapture || pDevice->alsa.isUsingMMapPlayback) {
                    /* MMAP */
                    return MA_INVALID_OPERATION;    /* Not yet implemented. */
                } else {
                    /* readi() and writei() */

                    /* The process is: device_read -> convert -> callback -> convert -> device_write */
                    ma_uint32 totalCapturedDeviceFramesProcessed = 0;
                    ma_uint32 capturedDevicePeriodSizeInFrames = ma_min(pDevice->capture.internalPeriodSizeInFrames, pDevice->playback.internalPeriodSizeInFrames);
                    
                    while (totalCapturedDeviceFramesProcessed < capturedDevicePeriodSizeInFrames) {
                        ma_uint8  capturedDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint8  playbackDeviceData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                        ma_uint32 capturedDeviceDataCapInFrames = sizeof(capturedDeviceData) / ma_get_bytes_per_frame(pDevice->capture.internalFormat,  pDevice->capture.internalChannels);
                        ma_uint32 playbackDeviceDataCapInFrames = sizeof(playbackDeviceData) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                        ma_uint32 capturedDeviceFramesRemaining;
                        ma_uint32 capturedDeviceFramesProcessed;
                        ma_uint32 capturedDeviceFramesToProcess;
                        ma_uint32 capturedDeviceFramesToTryProcessing = capturedDevicePeriodSizeInFrames - totalCapturedDeviceFramesProcessed;
                        if (capturedDeviceFramesToTryProcessing > capturedDeviceDataCapInFrames) {
                            capturedDeviceFramesToTryProcessing = capturedDeviceDataCapInFrames;
                        }

                        result = ma_device_read__alsa(pDevice, capturedDeviceData, capturedDeviceFramesToTryProcessing, &capturedDeviceFramesToProcess);
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }

                        capturedDeviceFramesRemaining = capturedDeviceFramesToProcess;
                        capturedDeviceFramesProcessed = 0;

                        for (;;) {
                            ma_uint8  capturedClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                            ma_uint8  playbackClientData[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                            ma_uint32 capturedClientDataCapInFrames = sizeof(capturedClientData) / ma_get_bytes_per_frame(pDevice->capture.format, pDevice->capture.channels);
                            ma_uint32 playbackClientDataCapInFrames = sizeof(playbackClientData) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
                            ma_uint64 capturedClientFramesToProcessThisIteration = ma_min(capturedClientDataCapInFrames, playbackClientDataCapInFrames);
                            ma_uint64 capturedDeviceFramesToProcessThisIteration = capturedDeviceFramesRemaining;
                            ma_uint8* pRunningCapturedDeviceFrames = ma_offset_ptr(capturedDeviceData, capturedDeviceFramesProcessed * ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels));

                            /* Convert capture data from device format to client format. */
                            result = ma_data_converter_process_pcm_frames(&pDevice->capture.converter, pRunningCapturedDeviceFrames, &capturedDeviceFramesToProcessThisIteration, capturedClientData, &capturedClientFramesToProcessThisIteration);
                            if (result != MA_SUCCESS) {
                                break;
                            }

                            /*
                            If we weren't able to generate any output frames it must mean we've exhaused all of our input. The only time this would not be the case is if capturedClientData was too small
                            which should never be the case when it's of the size MA_DATA_CONVERTER_STACK_BUFFER_SIZE.
                            */
                            if (capturedClientFramesToProcessThisIteration == 0) {
                                break;
                            }

                            ma_device__on_data(pDevice, playbackClientData, capturedClientData, (ma_uint32)capturedClientFramesToProcessThisIteration);    /* Safe cast .*/

                            capturedDeviceFramesProcessed += (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */
                            capturedDeviceFramesRemaining -= (ma_uint32)capturedDeviceFramesToProcessThisIteration; /* Safe cast. */

                            /* At this point the playbackClientData buffer should be holding data that needs to be written to the device. */
                            for (;;) {
                                ma_uint64 convertedClientFrameCount = capturedClientFramesToProcessThisIteration;
                                ma_uint64 convertedDeviceFrameCount = playbackDeviceDataCapInFrames;
                                result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, playbackClientData, &convertedClientFrameCount, playbackDeviceData, &convertedDeviceFrameCount);
                                if (result != MA_SUCCESS) {
                                    break;
                                }

                                result = ma_device_write__alsa(pDevice, playbackDeviceData, (ma_uint32)convertedDeviceFrameCount, NULL);    /* Safe cast. */
                                if (result != MA_SUCCESS) {
                                    exitLoop = MA_TRUE;
                                    break;
                                }

                                capturedClientFramesToProcessThisIteration -= (ma_uint32)convertedClientFrameCount;  /* Safe cast. */
                                if (capturedClientFramesToProcessThisIteration == 0) {
                                    break;
                                }
                            }

                            /* In case an error happened from ma_device_write__alsa()... */
                            if (result != MA_SUCCESS) {
                                exitLoop = MA_TRUE;
                                break;
                            }
                        }

                        totalCapturedDeviceFramesProcessed += capturedDeviceFramesProcessed;
                    }
                }
            } break;

            case ma_device_type_capture:
            {
                if (pDevice->alsa.isUsingMMapCapture) {
                    /* MMAP */
                    return MA_INVALID_OPERATION;    /* Not yet implemented. */
                } else {
                    /* readi() */

                    /* We read in chunks of the period size, but use a stack allocated buffer for the intermediary. */
                    ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->capture.internalFormat, pDevice->capture.internalChannels);
                    ma_uint32 periodSizeInFrames = pDevice->capture.internalPeriodSizeInFrames;
                    ma_uint32 framesReadThisPeriod = 0;
                    while (framesReadThisPeriod < periodSizeInFrames) {
                        ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesReadThisPeriod;
                        ma_uint32 framesProcessed;
                        ma_uint32 framesToReadThisIteration = framesRemainingInPeriod;
                        if (framesToReadThisIteration > intermediaryBufferSizeInFrames) {
                            framesToReadThisIteration = intermediaryBufferSizeInFrames;
                        }

                        result = ma_device_read__alsa(pDevice, intermediaryBuffer, framesToReadThisIteration, &framesProcessed);
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }

                        ma_device__send_frames_to_client(pDevice, framesProcessed, intermediaryBuffer);

                        framesReadThisPeriod += framesProcessed;
                    }
                }
            } break;

            case ma_device_type_playback:
            {
                if (pDevice->alsa.isUsingMMapPlayback) {
                    /* MMAP */
                    return MA_INVALID_OPERATION;    /* Not yet implemented. */
                } else {
                    /* writei() */

                    /* We write in chunks of the period size, but use a stack allocated buffer for the intermediary. */
                    ma_uint8 intermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];
                    ma_uint32 intermediaryBufferSizeInFrames = sizeof(intermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
                    ma_uint32 periodSizeInFrames = pDevice->playback.internalPeriodSizeInFrames;
                    ma_uint32 framesWrittenThisPeriod = 0;
                    while (framesWrittenThisPeriod < periodSizeInFrames) {
                        ma_uint32 framesRemainingInPeriod = periodSizeInFrames - framesWrittenThisPeriod;
                        ma_uint32 framesProcessed;
                        ma_uint32 framesToWriteThisIteration = framesRemainingInPeriod;
                        if (framesToWriteThisIteration > intermediaryBufferSizeInFrames) {
                            framesToWriteThisIteration = intermediaryBufferSizeInFrames;
                        }

                        ma_device__read_frames_from_client(pDevice, framesToWriteThisIteration, intermediaryBuffer);

                        result = ma_device_write__alsa(pDevice, intermediaryBuffer, framesToWriteThisIteration, &framesProcessed);
                        if (result != MA_SUCCESS) {
                            exitLoop = MA_TRUE;
                            break;
                        }

                        framesWrittenThisPeriod += framesProcessed;
                    }
                }
            } break;

            /* To silence a warning. Will never hit this. */
            case ma_device_type_loopback:
            default: break;
        } 
    }

    /* Here is where the device needs to be stopped. */
    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        ((ma_snd_pcm_drain_proc)pDevice->pContext->alsa.snd_pcm_drain)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);

        /* We need to prepare the device again, otherwise we won't be able to restart the device. */
        if (((ma_snd_pcm_prepare_proc)pDevice->pContext->alsa.snd_pcm_prepare)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture) < 0) {
    #ifdef MA_DEBUG_OUTPUT
            printf("[ALSA] Failed to prepare capture device after stopping.\n");
    #endif
        }
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        ((ma_snd_pcm_drain_proc)pDevice->pContext->alsa.snd_pcm_drain)((ma_snd_pcm_t*)pDevice->alsa.pPCMPlayback);

        /* We need to prepare the device again, otherwise we won't be able to restart the device. */
        if (((ma_snd_pcm_prepare_proc)pDevice->pContext->alsa.snd_pcm_prepare)((ma_snd_pcm_t*)pDevice->alsa.pPCMPlayback) < 0) {
    #ifdef MA_DEBUG_OUTPUT
            printf("[ALSA] Failed to prepare playback device after stopping.\n");
    #endif
        }
    }

    return result;
}